

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffeqtyll(fitsfile *fptr,int colnum,int *typecode,LONGLONG *repeat,LONGLONG *width,int *status)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  long tmpwidth;
  long lngzero;
  long lngscale;
  double max_val;
  double min_val;
  double tzero;
  double tscale;
  int effcode;
  int tcode;
  int decims;
  int hdutype;
  tcolumn *colptr;
  int *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  fitsfile *in_stack_ffffffffffffff78;
  long local_80;
  double local_70;
  double local_68;
  int local_50;
  int local_44;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_80 = 0;
  if (0 < *in_R9) {
    return *in_R9;
  }
  if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
       (iVar3 = ffrdef((fitsfile *)typecode,(int *)repeat), 0 < iVar3)) {
      return *in_R9;
    }
  }
  else {
    ffmahd((fitsfile *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(int)((ulong)in_RDX >> 0x20),
           in_RCX,in_R8);
  }
  if ((in_ESI < 1) || (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < in_ESI)) {
    *in_R9 = 0x12e;
    return 0x12e;
  }
  lVar4 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0;
  iVar3 = ffghdt(in_stack_ffffffffffffff78,
                 (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
  if (0 < iVar3) {
    return *in_R9;
  }
  if (local_44 == 1) {
    ffasfm((char *)width,status,(long *)colptr,_decims,_effcode);
    if (in_R8 != (int *)0x0) {
      *(fitsfile **)in_R8 = in_stack_ffffffffffffff78;
    }
    if (in_RCX != (int *)0x0) {
      in_RCX[0] = 1;
      in_RCX[1] = 0;
    }
  }
  else {
    if (in_RDX != (int *)0x0) {
      *in_RDX = *(int *)(lVar4 + 0x50);
    }
    if (in_R8 != (int *)0x0) {
      *(undefined8 *)in_R8 = *(undefined8 *)(lVar4 + 0x98);
    }
    if (in_RCX != (int *)0x0) {
      *(undefined8 *)in_RCX = *(undefined8 *)(lVar4 + 0x58);
    }
  }
  if (in_RDX == (int *)0x0) {
    return *in_R9;
  }
  dVar1 = *(double *)(lVar4 + 0x60);
  dVar2 = *(double *)(lVar4 + 0x68);
  if ((((dVar1 == 1.0) && (!NAN(dVar1))) && (dVar2 == 0.0)) && (!NAN(dVar2))) {
    return *in_R9;
  }
  iVar3 = *in_RDX;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  if (iVar3 == 0xb) {
    local_68 = 0.0;
    local_70 = 255.0;
  }
  else if (iVar3 == 0x15) {
    local_68 = -32768.0;
    local_70 = 32767.0;
  }
  else if (iVar3 == 0x29) {
    local_68 = -2147483648.0;
    local_70 = 2147483647.0;
  }
  else {
    if (iVar3 != 0x51) {
      return *in_R9;
    }
    local_68 = -9.223372036854776e+18;
    local_70 = 9.223372036854776e+18;
  }
  if (dVar1 < 0.0) {
    local_70 = dVar1 * local_68 + dVar2;
    local_68 = local_70;
  }
  else {
    local_70 = dVar1 * local_70 + dVar2;
  }
  local_68 = dVar1 * local_68 + dVar2;
  if (dVar2 < 2147483648.0) {
    local_80 = (long)dVar2;
  }
  if (((dVar2 == 2147483648.0) && (!NAN(dVar2))) ||
     ((dVar2 == 9.223372036854776e+18 && (!NAN(dVar2))))) {
LAB_00160860:
    if ((((local_68 != -128.0) || (NAN(local_68))) || (local_70 != 127.0)) || (NAN(local_70))) {
      if ((local_68 < -32768.0) || (32767.0 < local_70)) {
        if ((local_68 < 0.0) || (65535.0 < local_70)) {
          if ((local_68 < -2147483648.0) || (2147483647.0 < local_70)) {
            if ((local_68 < 0.0) || (4294967296.0 <= local_70)) {
              if ((local_68 < -9.223372036854776e+18) || (9.223372036854776e+18 < local_70)) {
                if ((local_68 < 0.0) || (1.8446744073709552e+19 < local_70)) {
                  local_50 = 0x52;
                }
                else {
                  local_50 = 0x50;
                }
              }
              else {
                local_50 = 0x51;
              }
            }
            else {
              local_50 = 0x28;
            }
          }
          else {
            local_50 = 0x29;
          }
        }
        else {
          local_50 = 0x14;
        }
      }
      else {
        local_50 = 0x15;
      }
    }
    else {
      local_50 = 0xc;
    }
  }
  else {
    if (((double)local_80 == dVar2) && (!NAN((double)local_80) && !NAN(dVar2))) {
      if (((double)(long)dVar1 == dVar1) && (!NAN((double)(long)dVar1) && !NAN(dVar1)))
      goto LAB_00160860;
    }
    if ((iVar3 == 0xb) || (iVar3 == 0x15)) {
      local_50 = 0x2a;
    }
    else {
      local_50 = 0x52;
    }
  }
  if (*in_RDX < 0) {
    *in_RDX = -local_50;
  }
  else {
    *in_RDX = local_50;
  }
  return *in_R9;
}

Assistant:

int ffeqtyll( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            LONGLONG *repeat,    /* O - repeat count of field                   */
            LONGLONG *width,     /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get the 'equivalent' table column type. 

  This routine is similar to the ffgtcl routine (which returns the physical
  datatype of the column, as stored in the FITS file) except that if the
  TSCALn and TZEROn keywords are defined for the column, then it returns
  the 'equivalent' datatype.  Thus, if the column is defined as '1I'  (short
  integer) this routine may return the type as 'TUSHORT' or as 'TFLOAT'
  depending on the TSCALn and TZEROn values.
  
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    tcolumn *colptr;
    int hdutype, decims, tcode, effcode;
    double tscale, tzero, min_val, max_val;
    long lngscale, lngzero = 0, tmpwidth;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += (colnum - 1);    /* offset to correct column */

    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == ASCII_TBL)
    {
      ffasfm(colptr->tform, typecode, &tmpwidth, &decims, status);
      if (width)
          *width = tmpwidth;

      if (repeat)
           *repeat = 1;
    }
    else
    {
      if (typecode)
          *typecode = colptr->tdatatype;

      if (width)
          *width = colptr->twidth;

      if (repeat)
          *repeat = colptr->trepeat;
    }

    /* return if caller is not interested in the typecode value */
    if (!typecode)
        return(*status);

    /* check if the tscale and tzero keywords are defined, which might
       change the effective datatype of the column  */

    tscale = colptr->tscale;
    tzero = colptr->tzero;

    if (tscale == 1.0 && tzero == 0.0)  /* no scaling */
        return(*status);
 
    tcode = abs(*typecode);

    switch (tcode)
    {
      case TBYTE:   /* binary table 'rB' column */
        min_val = 0.;
        max_val = 255.0;
        break;

      case TSHORT:
        min_val = -32768.0;
        max_val =  32767.0;
        break;
        
      case TLONG:

        min_val = -2147483648.0;
        max_val =  2147483647.0;
        break;
        
      case TLONGLONG:
        min_val = -9.2233720368547755808E18;
        max_val =  9.2233720368547755807E18;
        break;
	
      default:  /* don't have to deal with other data types */
        return(*status);
    }

    if (tscale >= 0.) {
        min_val = tzero + tscale * min_val;
        max_val = tzero + tscale * max_val;
    } else {
        max_val = tzero + tscale * min_val;
        min_val = tzero + tscale * max_val;
    }
    if (tzero < 2147483648.)  /* don't exceed range of 32-bit integer */
       lngzero = (long) tzero;
    lngscale   = (long) tscale;

    if ((tzero != 2147483648.) && /* special value that exceeds integer range */
        (tzero != 9223372036854775808.) &&  /* indicates unsigned long long */
       (lngzero != tzero || lngscale != tscale)) { /* not integers? */
       /* floating point scaled values; just decide on required precision */
       if (tcode == TBYTE || tcode == TSHORT)
          effcode = TFLOAT;
       else
          effcode = TDOUBLE;

    /*
       In all the remaining cases, TSCALn and TZEROn are integers,
       and not equal to 1 and 0, respectively.  
    */

    } else if ((min_val == -128.) && (max_val == 127.)) {
        effcode = TSBYTE;
 
    } else if ((min_val >= -32768.0) && (max_val <= 32767.0)) {
        effcode = TSHORT;

    } else if ((min_val >= 0.0) && (max_val <= 65535.0)) {
        effcode = TUSHORT;

    } else if ((min_val >= -2147483648.0) && (max_val <= 2147483647.0)) {
        effcode = TLONG;

    } else if ((min_val >= 0.0) && (max_val < 4294967296.0)) {
        effcode = TULONG;

    } else if ((min_val >= -9.2233720368547755808E18) && (max_val <= 9.2233720368547755807E18)) {
        effcode = TLONGLONG;

    } else if ((min_val >= 0.0) && (max_val <= 1.8446744073709551616E19)) {
        effcode = TULONGLONG;

    } else {  /* exceeds the range of a 64-bit integer */
        effcode = TDOUBLE;
    }   

    /* return the effective datatype code (negative if variable length col.) */
    if (*typecode < 0)  /* variable length array column */
        *typecode = -effcode;
    else
        *typecode = effcode;

    return(*status);
}